

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_assert(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectPtr *o;
  HSQUIRRELVM v_00;
  SQRESULT SVar2;
  HSQUIRRELVM in_RDI;
  SQChar *str;
  SQInteger top;
  SQChar **in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  SQRESULT local_8;
  
  o = stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
  bVar1 = SQVM::IsFalse(o);
  if (bVar1) {
    v_00 = (HSQUIRRELVM)sq_gettop(in_RDI);
    if ((2 < (long)v_00) && (SVar2 = sq_tostring(v,top), -1 < SVar2)) {
      in_stack_ffffffffffffffe0 = (HSQUIRRELVM)0x0;
      SVar2 = sq_getstring(v_00,0,in_stack_ffffffffffffffd8);
      if (-1 < SVar2) {
        SVar2 = sq_throwerror(in_stack_ffffffffffffffe0,(SQChar *)in_stack_ffffffffffffffd8);
        return SVar2;
      }
    }
    local_8 = sq_throwerror(in_stack_ffffffffffffffe0,(SQChar *)in_stack_ffffffffffffffd8);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static SQInteger base_assert(HSQUIRRELVM v)
{
    if(SQVM::IsFalse(stack_get(v,2))){
        SQInteger top = sq_gettop(v);
        if (top>2 && SQ_SUCCEEDED(sq_tostring(v,3))) {
            const SQChar *str = 0;
            if (SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
                return sq_throwerror(v, str);
            }
        }
        return sq_throwerror(v, _SC("assertion failed"));
    }
    return 0;
}